

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O1

int __thiscall
highs::RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (RbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  double dVar1;
  double dVar2;
  long lVar3;
  char *pcVar4;
  int iVar5;
  char *__to_00;
  ulong uVar6;
  
  if ((char *)*this->rootNode != (char *)0xffffffffffffffff) {
    lVar3 = this[2].rootNode[1];
    dVar1 = *(double *)(lVar3 + 0x48 + (long)__from * 0x90);
    pcVar4 = (char *)*this->rootNode;
    do {
      __to_00 = pcVar4;
      dVar2 = *(double *)(lVar3 + 0x48 + (long)__to_00 * 0x90);
      uVar6 = 1;
      if ((dVar1 <= dVar2) && (uVar6 = 0, dVar2 <= dVar1)) {
        uVar6 = (ulong)((long)__to_00 < (long)__from);
      }
      pcVar4 = *(char **)((long)__to_00 * 0x90 + lVar3 + 0x60 + uVar6 * 8);
    } while (pcVar4 != (char *)0xffffffffffffffff);
    iVar5 = CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                      ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)this,__from,__to_00);
    return iVar5;
  }
  iVar5 = CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                    ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)this,__from,
                     (char *)0xffffffffffffffff);
  return iVar5;
}

Assistant:

void link(LinkType z) {
    LinkType y = kNoLink;
    LinkType x = rootNode;
    while (x != kNoLink) {
      y = x;
      x = getChild(y, Dir(getKey(x) < getKey(z)));
    }

    static_cast<Impl*>(this)->link(z, y);
  }